

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O3

Token * __thiscall EOPlus::Lexer::ReadToken(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  int iVar2;
  _Elt_pointer pTVar3;
  Lexer *this_00;
  bool bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *pcVar9;
  runtime_error *this_01;
  Token *__return_storage_ptr___00;
  char c;
  Token token;
  char local_189;
  Token *local_188;
  TokenType local_180;
  undefined1 local_178 [16];
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  bool local_148;
  bool bStack_147;
  bool bStack_146;
  bool bStack_145;
  bool bStack_144;
  undefined3 uStack_143;
  var_type local_140;
  int local_138;
  Lexer *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  undefined1 local_120 [24];
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  bool local_e8;
  bool bStack_e7;
  bool bStack_e6;
  bool bStack_e5;
  bool bStack_e4;
  undefined3 uStack_e3;
  var_type local_e0;
  int local_d8;
  code *local_d0 [2];
  code *local_c0;
  code *local_b8;
  variant local_b0;
  variant local_70;
  
  util::variant::variant(&local_70);
  local_180 = Invalid;
  local_178._4_4_ = local_70._4_4_;
  local_178._0_4_ = local_70.val_int;
  local_178._12_4_ = local_70.val_float._4_4_;
  local_178._8_4_ = local_70.val_float._0_4_;
  local_168._M_p = (pointer)&local_158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,local_70.val_string._M_dataplus._M_p,
             local_70.val_string._M_dataplus._M_p + local_70.val_string._M_string_length);
  local_140 = local_70.type;
  local_148 = local_70.val_bool;
  bStack_147 = local_70.cache_val[0];
  bStack_146 = local_70.cache_val[1];
  bStack_145 = local_70.cache_val[2];
  bStack_144 = local_70.cache_val[3];
  uStack_143 = local_70._53_3_;
  local_138 = 0;
  local_188 = __return_storage_ptr__;
  local_130 = this;
  local_128 = &local_158;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.val_string._M_dataplus._M_p != &local_70.val_string.field_2) {
    operator_delete(local_70.val_string._M_dataplus._M_p,
                    local_70.val_string.field_2._M_allocated_capacity + 1);
  }
  local_189 = '\0';
  do {
    local_d0[1] = (code *)0x0;
    local_d0[0] = ctype_whitespace;
    local_b8 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
    local_c0 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
    bVar4 = GetCharIf(local_130,&local_189,(function<bool_(char)> *)local_d0);
    if (local_c0 != (code *)0x0) {
      (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
    }
    this_00 = local_130;
  } while (bVar4);
  pTVar3 = (local_130->token_buffer).c.
           super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if ((local_130->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur == pTVar3) {
    uVar6 = std::istream::peek();
    if (uVar6 == 0xffffffff) {
      util::variant::variant(&local_b0);
      local_120._0_4_ = EndOfFile;
      local_120._8_4_ = local_b0.val_int;
      local_120._12_4_ = local_b0._4_4_;
      local_120._16_4_ = local_b0.val_float._0_4_;
      local_120._20_4_ = local_b0.val_float._4_4_;
      local_108._M_p = (pointer)&local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,local_b0.val_string._M_dataplus._M_p,
                 local_b0.val_string._M_dataplus._M_p + local_b0.val_string._M_string_length);
      __return_storage_ptr___00 = local_188;
      local_e0 = local_b0.type;
      local_e8 = local_b0.val_bool;
      bStack_e7 = local_b0.cache_val[0];
      bStack_e6 = local_b0.cache_val[1];
      bStack_e5 = local_b0.cache_val[2];
      bStack_e4 = local_b0.cache_val[3];
      uStack_e3 = local_b0._53_3_;
      local_d8 = 0;
      local_180 = local_120._0_4_;
      local_178._4_4_ = local_120._12_4_;
      local_178._0_4_ = local_120._8_4_;
      local_178._8_8_ = CONCAT44(local_120._20_4_,local_120._16_4_);
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_108);
      local_148 = local_e8;
      bStack_147 = bStack_e7;
      bStack_146 = bStack_e6;
      bStack_145 = bStack_e5;
      bStack_144 = bStack_e4;
      uStack_143 = uStack_e3;
      local_140 = local_e0;
      local_138 = local_d8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.val_string._M_dataplus._M_p != &local_b0.val_string.field_2) {
        operator_delete(local_b0.val_string._M_dataplus._M_p,
                        local_b0.val_string.field_2._M_allocated_capacity + 1);
      }
      __return_storage_ptr___00->type = local_180;
      *(undefined8 *)&__return_storage_ptr___00->data = local_178._0_8_;
      (__return_storage_ptr___00->data).val_float = (double)local_178._8_8_;
      paVar8 = &(__return_storage_ptr___00->data).val_string.field_2;
      (__return_storage_ptr___00->data).val_string._M_dataplus._M_p = (pointer)paVar8;
      local_188 = __return_storage_ptr___00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_p != &local_158) goto LAB_0013c56a;
      goto LAB_0013c57c;
    }
    cVar5 = (char)uVar6;
    local_189 = cVar5;
    if ((int)cVar5 - 0x30U < 10) {
      ReadNumber((Token *)local_120,this_00);
LAB_0013c4d7:
      local_180 = local_120._0_4_;
      local_178._4_4_ = local_120._12_4_;
      local_178._0_4_ = local_120._8_4_;
      local_178._8_8_ = CONCAT44(local_120._20_4_,local_120._16_4_);
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_108);
      local_148 = local_e8;
      bStack_147 = bStack_e7;
      bStack_146 = bStack_e6;
      bStack_145 = bStack_e5;
      bStack_144 = bStack_e4;
      uStack_143 = uStack_e3;
      local_140 = local_e0;
      local_138 = local_d8;
      __return_storage_ptr___00 = local_188;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
LAB_0013c52f:
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
    }
    else {
      iVar7 = isalpha((int)cVar5);
      __return_storage_ptr___00 = local_188;
      if (((iVar7 != 0) || (cVar5 == '$')) || ((uVar6 & 0xff) == 0x5f)) {
        ReadIdentifier((Token *)local_120,this_00);
        goto LAB_0013c4d7;
      }
      pcVar9 = ";{}.,";
      do {
        cVar1 = *pcVar9;
        if (cVar1 == cVar5) break;
        pcVar9 = pcVar9 + 1;
      } while (cVar1 != '\0');
      if (cVar1 != '\0') {
        ReadSymbol((Token *)local_120,this_00);
        goto LAB_0013c4d7;
      }
      pcVar9 = "()&|=!<>+-*/%&|!";
      do {
        cVar1 = *pcVar9;
        if (cVar1 == cVar5) break;
        pcVar9 = pcVar9 + 1;
      } while (cVar1 != '\0');
      if (cVar1 == '\0') {
        if (cVar5 != '\"') goto LAB_0013c53f;
        ReadString((Token *)local_120,this_00);
        local_180 = local_120._0_4_;
        local_178._4_4_ = local_120._12_4_;
        local_178._0_4_ = local_120._8_4_;
        local_178._8_8_ = CONCAT44(local_120._20_4_,local_120._16_4_);
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_108);
        local_148 = local_e8;
        bStack_147 = bStack_e7;
        bStack_146 = bStack_e6;
        bStack_145 = bStack_e5;
        bStack_144 = bStack_e4;
        uStack_143 = uStack_e3;
        local_140 = local_e0;
        local_138 = local_d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_p == &local_f8) goto LAB_0013c53f;
        goto LAB_0013c52f;
      }
      ReadOperator((Token *)local_120,this_00);
      local_180 = local_120._0_4_;
      local_178._4_4_ = local_120._12_4_;
      local_178._0_4_ = local_120._8_4_;
      local_178._8_8_ = CONCAT44(local_120._20_4_,local_120._16_4_);
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_108);
      __return_storage_ptr___00 = local_188;
      local_148 = local_e8;
      bStack_147 = bStack_e7;
      bStack_146 = bStack_e6;
      bStack_145 = bStack_e5;
      bStack_144 = bStack_e4;
      uStack_143 = uStack_e3;
      local_140 = local_e0;
      local_138 = local_d8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      iVar7 = util::variant::GetInt((variant *)local_178);
      if ((iVar7 == 0xf) && (cVar5 = std::istream::peek(), cVar5 == '/')) {
        while (local_189 != '\n') {
          GetChar(this_00,&local_189);
        }
        ReadToken(__return_storage_ptr___00,this_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_p == &local_158) {
          return __return_storage_ptr___00;
        }
        operator_delete(local_168._M_p,
                        CONCAT44(local_158._M_allocated_capacity._4_4_,
                                 local_158._M_allocated_capacity._0_4_) + 1);
        return __return_storage_ptr___00;
      }
    }
LAB_0013c53f:
    if (local_180 == Invalid) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x20);
      local_120._0_8_ = local_120 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"Unknown token","");
      iVar7 = local_130->row;
      iVar2 = local_130->col;
      std::runtime_error::runtime_error(this_01,(string *)local_120);
      *(int *)(this_01 + 0x10) = iVar7;
      *(undefined ***)this_01 = &PTR__runtime_error_001d16a0;
      *(int *)(this_01 + 0x18) = iVar2;
      __cxa_throw(this_01,&Lexer_Error::typeinfo,std::runtime_error::~runtime_error);
    }
    __return_storage_ptr___00->type = local_180;
    *(undefined8 *)&__return_storage_ptr___00->data = local_178._0_8_;
    (__return_storage_ptr___00->data).val_float = (double)local_178._8_8_;
    paVar8 = &(__return_storage_ptr___00->data).val_string.field_2;
    (__return_storage_ptr___00->data).val_string._M_dataplus._M_p = (pointer)paVar8;
    local_188 = __return_storage_ptr___00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_p != &local_158) goto LAB_0013c56a;
  }
  else {
    local_180 = pTVar3->type;
    local_178._0_4_ = (pTVar3->data).val_int;
    local_178._4_4_ = *(undefined4 *)&(pTVar3->data).field_0x4;
    local_178._8_8_ = (pTVar3->data).val_float;
    std::__cxx11::string::_M_assign((string *)&local_168);
    local_140 = (pTVar3->data).type;
    local_148 = (pTVar3->data).val_bool;
    bStack_147 = (pTVar3->data).cache_val[0];
    bStack_146 = (pTVar3->data).cache_val[1];
    bStack_145 = (pTVar3->data).cache_val[2];
    bStack_144 = (pTVar3->data).cache_val[3];
    uStack_143 = *(undefined3 *)&(pTVar3->data).field_0x35;
    local_138 = pTVar3->newlines;
    std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::pop_front(&(this_00->token_buffer).c)
    ;
    local_188->type = local_180;
    *(undefined8 *)&local_188->data = local_178._0_8_;
    (local_188->data).val_float = (double)local_178._8_8_;
    paVar8 = &(local_188->data).val_string.field_2;
    (local_188->data).val_string._M_dataplus._M_p = (pointer)paVar8;
    __return_storage_ptr___00 = local_188;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_p != &local_158) {
LAB_0013c56a:
      (__return_storage_ptr___00->data).val_string._M_dataplus._M_p = local_168._M_p;
      (__return_storage_ptr___00->data).val_string.field_2._M_allocated_capacity =
           CONCAT44(local_158._M_allocated_capacity._4_4_,local_158._M_allocated_capacity._0_4_);
      goto LAB_0013c57f;
    }
  }
LAB_0013c57c:
  *(undefined4 *)paVar8 = local_158._M_allocated_capacity._0_4_;
  *(undefined4 *)((long)paVar8 + 4) = local_158._M_allocated_capacity._4_4_;
  *(undefined4 *)((long)paVar8 + 8) = local_158._8_4_;
  *(undefined4 *)((long)paVar8 + 0xc) = local_158._12_4_;
  __return_storage_ptr___00 = local_188;
LAB_0013c57f:
  (__return_storage_ptr___00->data).val_string._M_string_length = local_160;
  (__return_storage_ptr___00->data).val_bool = local_148;
  (__return_storage_ptr___00->data).cache_val[0] = bStack_147;
  (__return_storage_ptr___00->data).cache_val[1] = bStack_146;
  (__return_storage_ptr___00->data).cache_val[2] = bStack_145;
  (__return_storage_ptr___00->data).cache_val[3] = bStack_144;
  *(undefined3 *)&(__return_storage_ptr___00->data).field_0x35 = uStack_143;
  (__return_storage_ptr___00->data).type = local_140;
  __return_storage_ptr___00->newlines = local_138;
  return __return_storage_ptr___00;
}

Assistant:

Token Lexer::ReadToken()
	{
		Token token;

		char c = '\0';

		while (this->GetCharIf(c, ctype_whitespace)) ; // no loop body

		if (!this->token_buffer.empty())
		{
			token = this->token_buffer.front();
			this->token_buffer.pop();
			return token;
		}

		if (this->PeekChar(c))
		{
			if (ctype_digit(c))
			{
				token = this->ReadNumber();
			}
			else if (ctype_ident_start(c))
			{
				token = this->ReadIdentifier();
			}
			else if (ctype_symbol(c))
			{
				token = this->ReadSymbol();
			}
			else if (ctype_op(c)) // Assumes '/' is a valid operator
			{
				char cc = '\0';
				token = this->ReadOperator();

				if (int(token.data) == UOP2('/', '\0') && this->PeekChar(cc) && cc == '/') // Line-comments
				{
					while (c != '\n')
						this->GetChar(c);

					return this->ReadToken();
				}
			}
			else if (c == '"')
			{
				token = this->ReadString();
			}

			if (token.type == Token::Invalid)
				throw Lexer_Error("Unknown token", this->row, this->col);

			return token;
		}

		token = Token(Token::EndOfFile);

		return token;
	}